

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player.cpp
# Opt level: O0

void __thiscall CPlayer::Respawn(CPlayer *this)

{
  CPlayer *in_RDI;
  
  if (((in_RDI->m_RespawnDisabled & 1U) == 0) || (in_RDI->m_Team == -1)) {
    in_RDI->m_DeadSpecMode = false;
    if (in_RDI->m_Team != -1) {
      in_RDI->m_Spawning = true;
    }
  }
  else {
    in_RDI->m_DeadSpecMode = true;
    in_RDI->m_IsReadyToPlay = true;
    in_RDI->m_SpecMode = 1;
    UpdateDeadSpecMode(in_RDI);
  }
  return;
}

Assistant:

void CPlayer::Respawn()
{
	if(m_RespawnDisabled && m_Team != TEAM_SPECTATORS)
	{
		// enable spectate mode for dead players
		m_DeadSpecMode = true;
		m_IsReadyToPlay = true;
		m_SpecMode = SPEC_PLAYER;
		UpdateDeadSpecMode();
		return;
	}

	m_DeadSpecMode = false;

	if(m_Team != TEAM_SPECTATORS)
		m_Spawning = true;
}